

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O1

void __thiscall vera::HaveDefines::addDefine(HaveDefines *this,string *_define,vec4 _v)

{
  long *plVar1;
  long *plVar2;
  int in_R8D;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  undefined4 uStack_58;
  undefined4 uStack_54;
  string local_50;
  vec4 local_30;
  
  local_30 = _v;
  toString_abi_cxx11_(&local_50,(vera *)&local_30,(vec4 *)0x2c,'\x03',in_R8D);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2f1e88);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_80 = *plVar2;
    lStack_78 = plVar1[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar2;
    local_90 = (long *)*plVar1;
  }
  local_88 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_90);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_60 = *plVar2;
    uStack_58 = (undefined4)plVar1[3];
    uStack_54 = *(undefined4 *)((long)plVar1 + 0x1c);
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar2;
    local_70 = (long *)*plVar1;
  }
  local_68 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  (*this->_vptr_HaveDefines[10])(this,_define);
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void HaveDefines::addDefine( const std::string &_define, glm::vec4 _v ) {
    addDefine(_define, "vec4(" + toString(_v, ',') + ")");
}